

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::InstanceOfAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<2UL> *argAction;
  TTDVar pvVar2;
  RecyclableObject *pRVar3;
  ScriptContext *pSVar4;
  RecyclableObject *__obj_1;
  Var constructor;
  RecyclableObject *__obj;
  Var object;
  JsRTDoubleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)46>
                          (evt);
    pvVar2 = GetVarItem_0<2ul>(argAction);
    __obj = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
    if (__obj != (RecyclableObject *)0x0) {
      bVar1 = Js::VarIs<Js::RecyclableObject>(__obj);
      if (bVar1) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj);
        pSVar4 = Js::RecyclableObject::GetScriptContext(pRVar3);
        if (pSVar4 != scriptContext) {
          __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
      }
      pvVar2 = GetVarItem_1<2ul>(argAction);
      __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
      if (__obj_1 != (RecyclableObject *)0x0) {
        bVar1 = Js::VarIs<Js::RecyclableObject>(__obj_1);
        if (bVar1) {
          pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj_1);
          pSVar4 = Js::RecyclableObject::GetScriptContext(pRVar3);
          if (pSVar4 != scriptContext) {
            __obj_1 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
          }
        }
        Js::JavascriptOperators::OP_IsInst(__obj,__obj_1,scriptContext,(IsInstInlineCache *)0x0);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void InstanceOfAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::InstanceOfActionTag>(evt);
            Js::Var object = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(object, ctx);
            Js::Var constructor = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(constructor, ctx);

            // Result is not needed but trigger computation for any effects
            Js::JavascriptOperators::OP_IsInst(object, constructor, ctx, nullptr);
        }